

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O3

Abc_Des_t * Abc_DesDup(Abc_Des_t *p)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  Abc_Des_t *p_00;
  Abc_Ntk_t *pNtk;
  void **ppvVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  uint uVar9;
  undefined8 uVar10;
  long lVar11;
  
  p_00 = Abc_DesCreate(p->pName);
  pVVar6 = p->vModules;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      pNtk = Abc_NtkDup((Abc_Ntk_t *)pVVar6->pArray[lVar11]);
      Abc_DesAddModel(p_00,pNtk);
      lVar11 = lVar11 + 1;
      pVVar6 = p->vModules;
    } while (lVar11 < pVVar6->nSize);
  }
  pVVar7 = p->vTops;
  if (0 < pVVar7->nSize) {
    lVar11 = 0;
    do {
      pVVar6 = p_00->vTops;
      pvVar2 = *(void **)((long)pVVar7->pArray[lVar11] + 0x160);
      uVar9 = pVVar6->nSize;
      if (uVar9 == pVVar6->nCap) {
        if ((int)uVar9 < 0x10) {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar6->pArray,0x80);
          }
          pVVar6->pArray = ppvVar4;
          pVVar6->nCap = 0x10;
        }
        else {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar9 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar6->pArray,(ulong)uVar9 << 4);
          }
          pVVar6->pArray = ppvVar4;
          pVVar6->nCap = uVar9 * 2;
        }
      }
      else {
        ppvVar4 = pVVar6->pArray;
      }
      iVar1 = pVVar6->nSize;
      pVVar6->nSize = iVar1 + 1;
      ppvVar4[iVar1] = pvVar2;
      lVar11 = lVar11 + 1;
      pVVar7 = p->vTops;
    } while (lVar11 < pVVar7->nSize);
    pVVar6 = p->vModules;
  }
  iVar1 = pVVar6->nSize;
  if (0 < (long)iVar1) {
    ppvVar4 = pVVar6->pArray;
    lVar11 = 0;
    do {
      lVar8 = *(long *)((long)ppvVar4[lVar11] + 0xb8);
      if (lVar8 == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = *(undefined8 *)(lVar8 + 0x160);
      }
      *(undefined8 *)(*(long *)((long)ppvVar4[lVar11] + 0x160) + 0xb8) = uVar10;
      lVar11 = lVar11 + 1;
    } while (iVar1 != lVar11);
    if (0 < iVar1) {
      lVar11 = 0;
      do {
        pvVar2 = pVVar6->pArray[lVar11];
        lVar8 = *(long *)((long)pvVar2 + 0x50);
        if (0 < *(int *)(lVar8 + 4)) {
          lVar5 = 0;
          do {
            lVar3 = *(long *)(*(long *)(lVar8 + 8) + lVar5 * 8);
            uVar9 = *(uint *)(lVar3 + 0x14) & 0xf;
            if (uVar9 == 9) {
              *(undefined8 *)(*(long *)(lVar3 + 0x40) + 0x38) =
                   *(undefined8 *)(*(long *)(lVar3 + 0x38) + 0x160);
              lVar8 = *(long *)((long)pvVar2 + 0x50);
            }
            else if (uVar9 == 10) {
              __assert_fail("pObj->Type == ABC_OBJ_WHITEBOX",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x151,"Abc_Ntk_t *Abc_ObjModel(Abc_Obj_t *)");
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < *(int *)(lVar8 + 4));
          pVVar6 = p->vModules;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar6->nSize);
    }
  }
  return p_00;
}

Assistant:

Abc_Des_t * Abc_DesDup( Abc_Des_t * p )
{
    Abc_Des_t * pNew;
    Abc_Ntk_t * pTemp;
    Abc_Obj_t * pObj;
    int i, k;
    pNew = Abc_DesCreate( p->pName );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pTemp, i )
        Abc_DesAddModel( pNew, Abc_NtkDup(pTemp) );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vTops, pTemp, i )
        Vec_PtrPush( pNew->vTops, pTemp->pCopy );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pTemp, i )
        pTemp->pCopy->pAltView = pTemp->pAltView ? pTemp->pAltView->pCopy : NULL;
    // update box models
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pTemp, i )
        Abc_NtkForEachBox( pTemp, pObj, k )
            if ( Abc_ObjIsWhitebox(pObj) || Abc_ObjIsBlackbox(pObj) )
                pObj->pCopy->pData = Abc_ObjModel(pObj)->pCopy;
    return pNew;
}